

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_init_ex(uv_loop_t *loop,uv_udp_t *handle,uint flags,int domain)

{
  int local_2c;
  int fd;
  int domain_local;
  uint flags_local;
  uv_udp_t *handle_local;
  uv_loop_t *loop_local;
  
  local_2c = -1;
  if ((domain == 0) ||
     (local_2c = uv__socket(domain,2,0), loop_local._4_4_ = local_2c, -1 < local_2c)) {
    handle->loop = loop;
    handle->type = UV_UDP;
    handle->flags = 8;
    uv__queue_insert_tail(&loop->handle_queue,&handle->handle_queue);
    handle->next_closing = (uv_handle_t *)0x0;
    handle->alloc_cb = (uv_alloc_cb)0x0;
    handle->recv_cb = (uv_udp_recv_cb)0x0;
    handle->send_queue_size = 0;
    handle->send_queue_count = 0;
    uv__io_init(&handle->io_watcher,uv__udp_io,local_2c);
    uv__queue_init(&handle->write_queue);
    uv__queue_init(&handle->write_completed_queue);
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv__udp_init_ex(uv_loop_t* loop,
                    uv_udp_t* handle,
                    unsigned flags,
                    int domain) {
  int fd;

  fd = -1;
  if (domain != AF_UNSPEC) {
    fd = uv__socket(domain, SOCK_DGRAM, 0);
    if (fd < 0)
      return fd;
  }

  uv__handle_init(loop, (uv_handle_t*)handle, UV_UDP);
  handle->alloc_cb = NULL;
  handle->recv_cb = NULL;
  handle->send_queue_size = 0;
  handle->send_queue_count = 0;
  uv__io_init(&handle->io_watcher, uv__udp_io, fd);
  uv__queue_init(&handle->write_queue);
  uv__queue_init(&handle->write_completed_queue);

  return 0;
}